

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc_utils.c
# Opt level: O3

char * lrtr_strdup(char *string)

{
  long lVar1;
  size_t sVar2;
  void *__dest;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (string == (char *)0x0) {
    __assert_fail("string",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/alloc_utils.c"
                  ,0x4a,"char *lrtr_strdup(const char *)");
  }
  sVar2 = strlen(string);
  __dest = (*MALLOC_PTR)(sVar2 + 1);
  if (__dest == (void *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (char *)0x0;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pcVar3 = (char *)memcpy(__dest,string,sVar2 + 1);
    return pcVar3;
  }
  __stack_chk_fail();
}

Assistant:

char *lrtr_strdup(const char *string)
{
	assert(string);

	size_t length = strlen(string) + 1;
	char *new_string = lrtr_malloc(length);

	return new_string ? memcpy(new_string, string, length) : NULL;
}